

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChColor.cpp
# Opt level: O3

void __thiscall chrono::ChColor::ArchiveIN(ChColor *this,ChArchiveIn *marchive)

{
  char *local_38;
  ChColor *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChColor>(marchive);
  local_38 = "R";
  local_28 = 0;
  local_30 = this;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = (ChColor *)&this->G;
  local_38 = "G";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = (ChColor *)&this->B;
  local_38 = "B";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  return;
}

Assistant:

void ChColor::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChColor>();

    // stream in all member data:
    marchive >> CHNVP(R);
    marchive >> CHNVP(G);
    marchive >> CHNVP(B);
}